

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Eol_(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
       *this,bool t_eos)

{
  bool bVar1;
  
  if ((this->m_position).m_pos == (this->m_position).m_end) {
LAB_001ff214:
    bVar1 = false;
  }
  else {
    bVar1 = Symbol_(this,&m_cr_lf);
    if (!bVar1) {
      bVar1 = Char_(this,'\n');
      if (!bVar1) {
        if ((this->m_position).m_pos != (this->m_position).m_end && !t_eos) {
          bVar1 = Char_(this,';');
          return bVar1;
        }
        goto LAB_001ff214;
      }
    }
    (this->m_position).col = 1;
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

constexpr bool has_more() const noexcept { return m_pos != m_end; }